

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int __thiscall FBehavior::FindMapVarName(FBehavior *this,char *varname)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  
  piVar3 = (int *)this->Chunks;
  if (piVar3 != (int *)0x0) {
    for (; piVar3 < this->Data + this->DataSize;
        piVar3 = (int *)((long)piVar3 + (ulong)(piVar3[1] + 8))) {
      if (*piVar3 == 0x5058454d) {
        if (piVar3 == (int *)0x0) {
          return -1;
        }
        uVar1 = piVar3[2];
        if ((ulong)uVar1 != 0) {
          uVar4 = 0;
          do {
            iVar2 = strcasecmp(varname,(char *)((long)piVar3 +
                                               (ulong)(uint)piVar3[(int)uVar4 + 3] + 8));
            if (iVar2 == 0) {
              return (int)uVar4;
            }
            uVar4 = uVar4 + 1;
          } while (uVar1 != uVar4);
          return -1;
        }
        return -1;
      }
    }
  }
  iVar2 = FindStringInChunk(this,(DWORD *)0x0,varname);
  return iVar2;
}

Assistant:

int FBehavior::FindMapVarName (const char *varname) const
{
	return FindStringInChunk ((DWORD *)FindChunk (MAKE_ID('M','E','X','P')), varname);
}